

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O1

void __thiscall RealTrafficConnection::MainDirect(RealTrafficConnection *this)

{
  bool bVar1;
  int iVar2;
  cv_status cVar3;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar4;
  long lVar5;
  positionTy *ppVar6;
  positionTy *ppVar7;
  byte bVar8;
  unique_lock<std::mutex> lk;
  ThreadSettings TS;
  positionTy pos;
  unique_lock<std::mutex> local_120;
  ThreadSettings local_110;
  array<LTWeather::InterpolSet,_13UL> local_100;
  
  bVar8 = 0;
  ThreadSettings::ThreadSettings(&local_110,"LT_RT_Direct",0x1fbf,"C");
  bVar1 = false;
  this->eConnType = RT_CONN_REQU_REPL;
  std::deque<double,_std::allocator<double>_>::clear(&this->dequeTS);
  (this->curr).eRequType = RT_REQU_AUTH;
  (this->curr).sGUID._M_string_length = 0;
  *(this->curr).sGUID._M_dataplus._M_p = '\0';
  (this->rtWx).QNH = NAN;
  (this->rtWx).nErr = 0;
  this->lTotalFlights = -1;
  if (dataRefs.bChannel[2] != 0) {
    bVar1 = LTAptAvailable();
  }
  this->bDoParkedTraffic = bVar1;
  bVar1 = WeatherCanSet();
  if (bVar1) {
    LTWeather::ComputeInterpol(&local_100,&RT_ATMOS_LAYERS,&(this->rtWx).w.atmosphere_alt_levels_m);
    memcpy(&(this->rtWx).interp,&local_100,0xd0);
  }
  do {
    iVar2 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
              _vptr_LTChannel[4])(this);
    if ((char)iVar2 == '\0') {
      DataRefs::GetViewPos();
      SetRequType(this,(positionTy *)&local_100);
      iVar2 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                _vptr_LTChannel[0x10])(this,&local_100);
      if ((char)iVar2 != '\0') {
        iVar2 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                  _vptr_LTChannel[0x11])(this);
        if ((char)iVar2 != '\0') {
          (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel
            [9])(this);
        }
      }
      WeatherReset();
      ThreadSettings::~ThreadSettings(&local_110);
      return;
    }
    DataRefs::GetViewPos();
    bVar1 = positionTy::isNormal((positionTy *)&local_100,false);
    if (bVar1) {
      ppVar6 = (positionTy *)&local_100;
      ppVar7 = &(this->curr).pos;
      for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
        ppVar7->_lat = ppVar6->_lat;
        ppVar6 = (positionTy *)((long)ppVar6 + (ulong)bVar8 * -0x10 + 8);
        ppVar7 = (positionTy *)((long)ppVar7 + (ulong)bVar8 * -0x10 + 8);
      }
      iVar2 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                _vptr_LTChannel[0x10])(this,(positionTy *)&local_100);
      if ((char)iVar2 != '\0') {
        iVar2 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                  _vptr_LTChannel[0x11])(this);
        if ((char)iVar2 != '\0') {
          (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel
            [9])(this);
        }
      }
      tVar4 = SetRequType(this,(positionTy *)&local_100);
    }
    else {
      lVar5 = std::chrono::_V2::steady_clock::now();
      tVar4.__d.__r = (duration)(lVar5 + 1000000000);
    }
    (this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.tNextWakeup.__d.__r =
         (rep)tVar4.__d.__r;
    local_120._M_device = &FDThreadSynchMutex;
    local_120._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_120);
    local_120._M_owns = true;
    do {
      iVar2 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                _vptr_LTChannel[4])(this);
      if ((char)iVar2 == '\0') goto LAB_00193a9c;
      cVar3 = std::condition_variable::
              __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                        ((condition_variable *)FDThreadSynchCV,&local_120,
                         &(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                          tNextWakeup);
    } while (cVar3 != timeout);
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[4])
              (this);
LAB_00193a9c:
    std::unique_lock<std::mutex>::~unique_lock(&local_120);
  } while( true );
}

Assistant:

void RealTrafficConnection::MainDirect ()
{
    // This is a communication thread's main function, set thread's name and C locale
    ThreadSettings TS ("LT_RT_Direct", LC_ALL_MASK);
    eConnType = RT_CONN_REQU_REPL;
    // Clear the list of historic time stamp differences
    dequeTS.clear();
    // Some more data resets to make sure we start over with the series of requests
    curr.eRequType = CurrTy::RT_REQU_AUTH;
    curr.sGUID.clear();
    rtWx.QNH = NAN;
    rtWx.nErr = 0;
    lTotalFlights = -1;
    // can right away read parked traffic if parked aircraft enabled and airport data is already available, otherwise we'll be triggered later when airport data has been processed
    bDoParkedTraffic = dataRefs.ShallKeepParkedAircraft() && LTAptAvailable();
    // If we could theoretically set weather we prepare the interpolation settings
    if (WeatherCanSet()) {
        rtWx.interp = LTWeather::ComputeInterpol(RT_ATMOS_LAYERS,
                                                 rtWx.w.atmosphere_alt_levels_m);
    }

    while ( shallRun() ) {
        // LiveTraffic Top Level Exception Handling
        try {
            // where are we right now?
            const positionTy pos (dataRefs.GetViewPos());

            // If the camera position is valid we can request data around it
            if (pos.isNormal()) {
                // Fetch data and process it
                curr.pos = pos;
                if (FetchAllData(pos) && ProcessFetchedData())
                    // reduce error count if processed successfully
                    // as a chance to appear OK in the long run
                    DecErrCnt();
                
                // Determine next action and wait time
                tNextWakeup = SetRequType(pos);
            }
            else {
                // Camera position is yet invalid, retry in a second
                tNextWakeup = std::chrono::steady_clock::now() + std::chrono::seconds(1);
            }
            
            // sleep for a bit or if woken up for termination
            // by condition variable trigger
            {
                std::unique_lock<std::mutex> lk(FDThreadSynchMutex);
                FDThreadSynchCV.wait_until(lk, tNextWakeup,
                                           [this]{return !shallRun();});
            }
            
        } catch (const std::exception& e) {
            LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, e.what());
            IncErrCnt();
        } catch (...) {
            LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, "(unknown type)");
            IncErrCnt();
        }
    }
    
    // Close the session with RealTraffic
    try {
        const positionTy pos (dataRefs.GetViewPos());
        SetRequType(pos);
        if (FetchAllData(pos) && ProcessFetchedData())
            // reduce error count if processed successfully
            // as a chance to appear OK in the long run
            DecErrCnt();
    } catch (const std::exception& e) {
        LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, e.what());
        IncErrCnt();
    } catch (...) {
        LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, "(unknown type)");
        IncErrCnt();
    }
    
    // Reset weather control (this assumes noone else can control weather and
    // would need to change once any other source in LiveTraffic can do so)
    WeatherReset();
}